

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Struct.hpp
# Opt level: O3

bool Reflection::get<double>(Struct *target,string *name,double *value,size_t offset)

{
  char *pcVar1;
  char *__s2;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar4;
  undefined4 extraout_var_01;
  bool bVar5;
  double dVar6;
  char *local_38;
  type_info *type;
  
  iVar2 = (*target->_vptr_Struct[1])();
  __s2 = _glCreateShader;
  type = (type_info *)CONCAT44(extraout_var,iVar2);
  if (type == (type_info *)0x0) {
    return false;
  }
  pcVar1 = *(char **)(type + 8);
  if (pcVar1 == _glCreateShader) {
LAB_00428dab:
    iVar2 = (*target->_vptr_Struct[5])(target,name);
    dVar6 = *(double *)(CONCAT44(extraout_var_00,iVar2) + offset * 8);
  }
  else {
    if (*pcVar1 == '*') {
      if (pcVar1 != __M_erase) {
        TypeInfo::size(type);
        return false;
      }
      local_38 = __M_erase;
LAB_00428dd1:
      bVar5 = false;
    }
    else {
      iVar2 = strcmp(pcVar1,_glCreateShader);
      if (iVar2 == 0) goto LAB_00428dab;
      local_38 = __M_erase;
      if ((pcVar1 == __M_erase) || (iVar2 = strcmp(pcVar1,__M_erase), iVar2 == 0))
      goto LAB_00428dd1;
      iVar2 = strcmp(pcVar1,__s2);
      bVar5 = iVar2 != 0;
    }
    sVar4 = TypeInfo::size(type);
    if (7 < sVar4 || bVar5) {
      return false;
    }
    iVar2 = (*target->_vptr_Struct[5])(target,name);
    pcVar1 = *(char **)(type + 8);
    if ((pcVar1 == local_38) || ((*pcVar1 != '*' && (iVar3 = strcmp(pcVar1,local_38), iVar3 == 0))))
    {
      *value = (double)*(float *)(CONCAT44(extraout_var_01,iVar2) + sVar4 * offset);
    }
    if (pcVar1 != __s2) {
      if (*pcVar1 == '*') {
        return true;
      }
      iVar3 = strcmp(pcVar1,__s2);
      if (iVar3 != 0) {
        return true;
      }
    }
    dVar6 = *(double *)(CONCAT44(extraout_var_01,iVar2) + sVar4 * offset);
  }
  *value = dVar6;
  return true;
}

Assistant:

bool get(const Struct &target, const std::string &name, Type &value, size_t offset) {
	const auto target_type = target.type_of(name);
	if(!target_type) return false;

	// If type is a direct match, copy.
	if(*target_type == typeid(Type)) {
		const auto address = reinterpret_cast<const uint8_t *>(target.get(name)) + offset * sizeof(Type);
		value = *reinterpret_cast<const Type *>(address);
		return true;
	}

	// If the type is a registered enum and the value type is int, copy.
	if constexpr (std::is_integral<Type>::value && sizeof(Type) == sizeof(int)) {
		if(!Enum::name(*target_type).empty()) {
			memcpy(&value, target.get(name), sizeof(int));
			return true;
		}
	}

	// If the type is an int that is larger than the stored type and matches the signedness, cast upward.
	if constexpr (std::is_integral<Type>::value) {
		if(TypeInfo::is_integral(target_type)) {
			const bool target_is_signed = TypeInfo::is_signed(target_type);
			const size_t target_size = TypeInfo::size(target_type);

			// An unsigned type can map to any larger type, signed or unsigned;
			// a signed type can map to a larger type only if it also is signed.
			if(sizeof(Type) > target_size && (!target_is_signed || std::is_signed<Type>::value)) {
				const auto address = reinterpret_cast<const uint8_t *>(target.get(name)) + offset * target_size;

#define Map(x)	if(*target_type == typeid(x)) { value = static_cast<Type>(*reinterpret_cast<const x *>(address)); }
				ForAllInts(Map);
#undef Map
				return true;
			}
		}
	}

	// If the type is a double and stored type is a float, cast upward.
	if constexpr (std::is_floating_point<Type>::value) {
		constexpr size_t size = sizeof(Type);
		const bool target_is_floating_point = TypeInfo::is_floating_point(target_type);
		const size_t target_size = TypeInfo::size(target_type);

		if(size > target_size && target_is_floating_point) {
				const auto address = reinterpret_cast<const uint8_t *>(target.get(name)) + offset * target_size;

#define Map(x)	if(*target_type == typeid(x)) { value = static_cast<Type>(*reinterpret_cast<const x *>(address)); }
			ForAllFloats(Map);
#undef Map
			return true;
		}
	}

	return false;
}